

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::stackBefore(QGraphicsItem *this,QGraphicsItem *sibling)

{
  int iVar1;
  int iVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsItem *pQVar5;
  long lVar6;
  qsizetype qVar7;
  const_reference ppQVar8;
  int *piVar9;
  QList<QGraphicsItem_*> *this_00;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int *index_1;
  int i_1;
  int *index;
  int i;
  int myIndex;
  int siblingIndex;
  QList<QGraphicsItem_*> *siblings;
  char *in_stack_ffffffffffffff38;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar10;
  QMessageLogger *in_stack_ffffffffffffff50;
  QGraphicsScenePrivate *local_a8;
  QGraphicsScenePrivate *this_01;
  int local_7c;
  int local_6c;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDI) {
    if (in_RSI != 0) {
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 8));
      pQVar3 = pQVar4->parent;
      pQVar5 = parentItem((QGraphicsItem *)0x980318);
      if (pQVar3 == pQVar5) {
        pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)(in_RDI + 8));
        if (pQVar4->parent == (QGraphicsItem *)0x0) {
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)(in_RDI + 8));
          if (pQVar4->scene == (QGraphicsScene *)0x0) {
            local_a8 = (QGraphicsScenePrivate *)0x0;
          }
          else {
            QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
            operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                        *)(in_RDI + 8));
            local_a8 = QGraphicsScene::d_func((QGraphicsScene *)0x9803d0);
            local_a8 = (QGraphicsScenePrivate *)&local_a8->topLevelItems;
          }
        }
        else {
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)(in_RDI + 8));
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&pQVar4->parent->d_ptr);
          local_a8 = (QGraphicsScenePrivate *)&pQVar4->children;
        }
        if (local_a8 == (QGraphicsScenePrivate *)0x0) {
          QMessageLogger::QMessageLogger
                    (in_stack_ffffffffffffff50,
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),in_stack_ffffffffffffff38);
          QMessageLogger::warning
                    (local_48,
                     "QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling",
                     in_RSI);
        }
        else {
          this_01 = local_a8;
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)(in_RDI + 8));
          if (pQVar4->parent == (QGraphicsItem *)0x0) {
            QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
            operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                        *)(in_RDI + 8));
            QGraphicsScene::d_func((QGraphicsScene *)0x980492);
            QGraphicsScenePrivate::ensureSequentialTopLevelSiblingIndexes(this_01);
          }
          else {
            pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)(in_RDI + 8));
            QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
            operator->(&pQVar4->parent->d_ptr);
            QGraphicsItemPrivate::ensureSequentialSiblingIndex((QGraphicsItemPrivate *)this_01);
          }
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)(in_RSI + 8));
          iVar1 = pQVar4->siblingIndex;
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)(in_RDI + 8));
          iVar2 = pQVar4->siblingIndex;
          if (iVar1 <= iVar2) {
            QList<QGraphicsItem_*>::move
                      ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff50,
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (qsizetype)in_stack_ffffffffffffff40);
            local_6c = 0;
            while( true ) {
              lVar6 = (long)local_6c;
              qVar7 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)local_a8);
              if (qVar7 <= lVar6) break;
              ppQVar8 = QList<QGraphicsItem_*>::at
                                  (in_stack_ffffffffffffff40,(qsizetype)in_stack_ffffffffffffff38);
              pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       ::operator->(&(*ppQVar8)->d_ptr);
              piVar9 = &pQVar4->siblingIndex;
              if (((local_6c != iVar1) && (iVar1 <= *piVar9)) && (*piVar9 <= iVar2)) {
                *piVar9 = *piVar9 + 1;
              }
              local_6c = local_6c + 1;
            }
            iVar10 = iVar1;
            pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)(in_RDI + 8));
            pQVar4->siblingIndex = iVar10;
            local_7c = 0;
            while( true ) {
              this_00 = (QList<QGraphicsItem_*> *)(long)local_7c;
              qVar7 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)local_a8);
              if (qVar7 <= (long)this_00) break;
              ppQVar8 = QList<QGraphicsItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff38);
              pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       ::operator->(&(*ppQVar8)->d_ptr);
              if (((local_7c != iVar1) && (iVar1 <= pQVar4->siblingIndex)) &&
                 (pQVar4->siblingIndex <= iVar2)) {
                ppQVar8 = QList<QGraphicsItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff38);
                pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         ::operator->(&(*ppQVar8)->d_ptr);
                (*pQVar4->_vptr_QGraphicsItemPrivate[10])();
              }
              local_7c = local_7c + 1;
            }
            pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)(in_RDI + 8));
            (*pQVar4->_vptr_QGraphicsItemPrivate[10])();
          }
        }
        goto LAB_0098067f;
      }
    }
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),in_stack_ffffffffffffff38);
    QMessageLogger::warning
              (local_28,"QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling",
               in_RSI);
  }
LAB_0098067f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::stackBefore(const QGraphicsItem *sibling)
{
    if (sibling == this)
        return;
    if (!sibling || d_ptr->parent != sibling->parentItem()) {
        qWarning("QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling", sibling);
        return;
    }
    QList<QGraphicsItem *> *siblings = d_ptr->parent
                                       ? &d_ptr->parent->d_ptr->children
                                       : (d_ptr->scene ? &d_ptr->scene->d_func()->topLevelItems : nullptr);
    if (!siblings) {
        qWarning("QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling", sibling);
        return;
    }

    // First, make sure that the sibling indexes have no holes. This also
    // marks the children list for sorting.
    if (d_ptr->parent)
        d_ptr->parent->d_ptr->ensureSequentialSiblingIndex();
    else
        d_ptr->scene->d_func()->ensureSequentialTopLevelSiblingIndexes();

    // Only move items with the same Z value, and that need moving.
    int siblingIndex = sibling->d_ptr->siblingIndex;
    int myIndex = d_ptr->siblingIndex;
    if (myIndex >= siblingIndex) {
        siblings->move(myIndex, siblingIndex);
        // Fixup the insertion ordering.
        for (int i = 0; i < siblings->size(); ++i) {
            int &index = siblings->at(i)->d_ptr->siblingIndex;
            if (i != siblingIndex && index >= siblingIndex && index <= myIndex)
                ++index;
        }
        d_ptr->siblingIndex = siblingIndex;
        for (int i = 0; i < siblings->size(); ++i) {
            int &index = siblings->at(i)->d_ptr->siblingIndex;
            if (i != siblingIndex && index >= siblingIndex && index <= myIndex)
                siblings->at(i)->d_ptr->siblingOrderChange();
        }
        d_ptr->siblingOrderChange();
    }
}